

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

boolean encode_mcu_gather(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  long in_RSI;
  JCOEFPTR in_RDI;
  jpeg_component_info *compptr;
  int ci;
  int blkn;
  huff_entropy_ptr entropy;
  int iVar1;
  int iVar2;
  long *dc_counts;
  
  dc_counts = *(long **)(in_RDI + 0xf8);
  if (*(int *)(in_RDI + 0x8c) != 0) {
    if ((int)dc_counts[7] == 0) {
      for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0xa2); iVar1 = iVar1 + 1) {
        *(undefined4 *)((long)dc_counts + (long)iVar1 * 4 + 0x24) = 0;
      }
      *(undefined4 *)(dc_counts + 7) = *(undefined4 *)(in_RDI + 0x8c);
    }
    *(int *)(dc_counts + 7) = (int)dc_counts[7] + -1;
  }
  for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0xb8); iVar1 = iVar1 + 1) {
    iVar2 = *(int *)(in_RDI + (long)iVar1 * 2 + 0xba);
    htest_one_block((j_compress_ptr)compptr,in_RDI,(int)((ulong)in_RSI >> 0x20),dc_counts,
                    (long *)CONCAT44(iVar1,iVar2));
    *(int *)((long)dc_counts + (long)iVar2 * 4 + 0x24) = (int)**(short **)(in_RSI + (long)iVar1 * 8)
    ;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_gather(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  int blkn, ci;
  jpeg_component_info *compptr;

  /* Take care of restart intervals if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      /* Re-initialize DC predictions to 0 */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++)
        entropy->saved.last_dc_val[ci] = 0;
      /* Update restart state */
      entropy->restarts_to_go = cinfo->restart_interval;
    }
    entropy->restarts_to_go--;
  }

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];
    htest_one_block(cinfo, MCU_data[blkn][0], entropy->saved.last_dc_val[ci],
                    entropy->dc_count_ptrs[compptr->dc_tbl_no],
                    entropy->ac_count_ptrs[compptr->ac_tbl_no]);
    entropy->saved.last_dc_val[ci] = MCU_data[blkn][0][0];
  }

  return TRUE;
}